

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<netlist::ContinuousAssignVisitor,_false,_true,_false,_false>::
visit<slang::ast::UniquenessConstraint>
          (ASTVisitor<netlist::ContinuousAssignVisitor,_false,_true,_false,_false> *this,
          UniquenessConstraint *t)

{
  bool bVar1;
  Constraint *in_RSI;
  UniquenessConstraint *in_RDI;
  
  bVar1 = Constraint::bad(in_RSI);
  if (!bVar1) {
    visitDefault<slang::ast::UniquenessConstraint>
              ((ASTVisitor<netlist::ContinuousAssignVisitor,_false,_true,_false,_false> *)in_RSI,
               in_RDI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }